

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yamc_lock_validator.hpp
# Opt level: O2

void yamc::validator::deadlock::unlocked(uintptr_t mkey,id tid,bool shared)

{
  mapped_type *pmVar1;
  uintptr_t local_40;
  unique_lock<std::mutex> local_38;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_yamc::validator::deadlock::entry>,_std::allocator<std::pair<const_unsigned_long,_yamc::validator::deadlock::entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_28;
  
  local_40 = mkey;
  global_table();
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_yamc::validator::deadlock::entry>,_std::allocator<std::pair<const_unsigned_long,_yamc::validator::deadlock::entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](local_28,&local_40);
  remove_elem<std::thread::id>(&pmVar1->owners,tid);
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

static void unlocked(uintptr_t mkey, std::thread::id tid, bool shared)
  {
    auto&& table = global_table();
    remove_elem(table.mutexmap[mkey].owners, tid);
#if YAMC_CHECK_VERBOSE
    std::cout << "Thread#" << tid << " released Mutex#" << table.mutexmap[mkey].mid
      << " " << (shared ? "shared-lock" : "lock") << '\n';
    dump_mutexmap(std::cout, table.mutexmap);
#else
    (void)shared;  // suppress "unused variable" warning
#endif
  }